

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::clearFocus(QWidget *this)

{
  undefined1 *puVar1;
  QWidgetData **ppQVar2;
  QWidget *pQVar3;
  QObject *pQVar4;
  bool bVar5;
  long lVar6;
  QWidget *pQVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  code *local_48;
  undefined1 *puStack_40;
  QWidget *local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = hasFocus(this);
  pQVar7 = this;
  if (bVar5) {
    if ((this->data->widget_attributes & 0x4000) != 0) {
      QGuiApplication::inputMethod();
      QInputMethod::commit();
    }
    local_38 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = (code *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QFocusEvent::QFocusEvent((QFocusEvent *)&local_48,FocusAboutToChange,OtherFocusReason);
    QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_48);
    QFocusEvent::~QFocusEvent((QFocusEvent *)&local_48);
  }
  do {
    puVar1 = &pQVar7->field_0x8;
    pQVar3 = *(QWidget **)(*(long *)puVar1 + 0x10);
    if (pQVar3 == (QWidget *)0x0) break;
    ppQVar2 = &pQVar7->data;
    pQVar7 = pQVar3;
  } while ((((*ppQVar2)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
  lVar9 = *(long *)(*(long *)puVar1 + 0x78);
  pQVar7 = this;
  if ((lVar9 == 0) || (lVar9 = *(long *)(lVar9 + 8), lVar9 == 0)) {
    lVar9 = 0;
  }
  else if (*(long **)(lVar9 + 0x20) != (long *)0x0) {
    lVar6 = (**(code **)(**(long **)(lVar9 + 0x20) + 0x80))();
    if (lVar6 == 0) {
      lVar6 = *(long *)(*(long *)&this->field_0x8 + 0x90);
    }
    goto LAB_002fa07c;
  }
  lVar6 = 0;
LAB_002fa07c:
  do {
    lVar8 = *(long *)&pQVar7->field_0x8;
    if (*(QWidget **)(lVar8 + 0x90) == this) {
      *(undefined8 *)(lVar8 + 0x90) = 0;
    }
    pQVar7 = *(QWidget **)(lVar8 + 0x10);
  } while (*(QWidget **)(lVar8 + 0x10) != (QWidget *)0x0);
  if ((lVar6 != 0) && (lVar8 = (**(code **)(**(long **)(lVar9 + 0x20) + 0x80))(), lVar6 != lVar8)) {
    pQVar4 = *(QObject **)(lVar9 + 0x20);
    (**(code **)(*(long *)pQVar4 + 0x80))(pQVar4);
    QWindow::focusObjectChanged(pQVar4);
  }
  lVar9 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if ((lVar9 != 0) && (lVar9 = *(long *)(lVar9 + 0x10), lVar9 != 0)) {
    QGraphicsItem::clearFocus((QGraphicsItem *)(lVar9 + 0x10));
  }
  bVar5 = hasFocus(this);
  if (bVar5) {
    QApplicationPrivate::setFocusWidget((QWidget *)0x0,OtherFocusReason);
    local_48 = QFont::strikeOut;
    puStack_40 = (undefined1 *)0xaaaaaaaa00008005;
    local_30 = 0xaaaaaaaaffffffff;
    local_38 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::clearFocus()
{
    if (hasFocus()) {
        if (testAttribute(Qt::WA_InputMethodEnabled))
            QGuiApplication::inputMethod()->commit();

        QFocusEvent focusAboutToChange(QEvent::FocusAboutToChange);
        QCoreApplication::sendEvent(this, &focusAboutToChange);
    }

    QTLWExtra *extra = window()->d_func()->maybeTopData();
    QObject *originalFocusObject = nullptr;
    if (extra && extra->window) {
        originalFocusObject = extra->window->focusObject();
        // the window's focus object might already be nullptr if we are in the destructor, but we still
        // need to update QGuiApplication and input context if we have a focus widget.
        if (!originalFocusObject)
            originalFocusObject = focusWidget();
    }

    QWidget *w = this;
    while (w) {
        // Just like setFocus(), we update (clear) the focus_child of our parents
        if (w->d_func()->focus_child == this)
            w->d_func()->focus_child = nullptr;
        w = w->parentWidget();
    }

    // We've potentially cleared the focus_child of our parents, so we need
    // to report this to the rest of Qt. Note that the focus_child is not the same
    // thing as the application's focusWidget, which is why this piece of code is
    // not inside a hasFocus() block.
    if (originalFocusObject && originalFocusObject != extra->window->focusObject())
        emit extra->window->focusObjectChanged(extra->window->focusObject());

#if QT_CONFIG(graphicsview)
    const auto &topData = d_func()->extra;
    if (topData && topData->proxyWidget)
        topData->proxyWidget->clearFocus();
#endif

    if (hasFocus()) {
        // Update proxy state
        QApplicationPrivate::setFocusWidget(nullptr, Qt::OtherFocusReason);
#if QT_CONFIG(accessibility)
        QAccessibleEvent event(this, QAccessible::Focus);
        QAccessible::updateAccessibility(&event);
#endif
    }
}